

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O1

void __thiscall
RenX::BanDatabase::process_data(BanDatabase *this,DataBuffer *buffer,FILE *file,fpos_t pos)

{
  _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint16_t *puVar5;
  rep rVar6;
  uint64_t uVar7;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> _Var8;
  Entry *__s;
  mapped_type *this_01;
  uint8_t **extraout_RDX;
  uint8_t **extraout_RDX_00;
  uint8_t **extraout_RDX_01;
  uint8_t **extraout_RDX_02;
  uint8_t **extraout_RDX_03;
  uint8_t **extraout_RDX_04;
  uint8_t **extraout_RDX_05;
  uint8_t **extraout_RDX_06;
  uint8_t **extraout_RDX_07;
  uint8_t **extraout_RDX_08;
  uint8_t **head;
  uint8_t **extraout_RDX_09;
  uint8_t **extraout_RDX_10;
  uint8_t **extraout_RDX_11;
  uint8_t **ppuVar9;
  long lVar10;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> entry;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  BanDatabase *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = this->m_read_version;
  if (2 < bVar2) {
    local_60 = this;
    __s = (Entry *)operator_new(0x110);
    local_58 = &(__s->hwid).field_2;
    memset(__s,0,0x110);
    (__s->hwid)._M_dataplus._M_p = (pointer)local_58;
    (__s->hwid)._M_string_length = 0;
    (__s->hwid).field_2._M_local_buf[0] = '\0';
    (__s->rdns)._M_dataplus._M_p = (pointer)&(__s->rdns).field_2;
    (__s->rdns)._M_string_length = 0;
    (__s->rdns).field_2._M_local_buf[0] = '\0';
    (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
    (__s->name)._M_string_length = 0;
    (__s->name).field_2._M_local_buf[0] = '\0';
    (__s->banner)._M_dataplus._M_p = (pointer)&(__s->banner).field_2;
    (__s->banner)._M_string_length = 0;
    (__s->banner).field_2._M_local_buf[0] = '\0';
    (__s->reason)._M_dataplus._M_p = (pointer)&(__s->reason).field_2;
    (__s->reason)._M_string_length = 0;
    (__s->reason).field_2._M_local_buf[0] = '\0';
    (__s->varData)._M_h._M_buckets = &(__s->varData)._M_h._M_single_bucket;
    (__s->varData)._M_h._M_bucket_count = 1;
    (__s->varData)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__s->varData)._M_h._M_element_count = 0;
    (__s->varData)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__s->varData)._M_h._M_rehash_policy._M_next_resize = 0;
    (__s->varData)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__s->pos).__pos = pos.__pos;
    (__s->pos).__state = pos.__state;
    this_00 = (_Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>
               *)(buffer + 8);
    puVar5 = *(uint16_t **)(buffer + 8);
    uVar3 = *puVar5;
    *(uint16_t **)(buffer + 8) = puVar5 + 1;
    __s->flags = uVar3;
    lVar10 = *(long *)(puVar5 + 1);
    *(uint16_t **)(buffer + 8) = puVar5 + 5;
    (__s->timestamp).__d.__r = lVar10 * 1000000000;
    rVar6 = *(rep *)(puVar5 + 5);
    *(uint16_t **)(buffer + 8) = puVar5 + 9;
    (__s->length).__r = rVar6;
    uVar7 = *(uint64_t *)(puVar5 + 9);
    *(uint16_t **)(buffer + 8) = puVar5 + 0xd;
    __s->steamid = uVar7;
    uVar4 = *(uint32_t *)(puVar5 + 0xd);
    ppuVar9 = (uint8_t **)(puVar5 + 0xf);
    *(uint8_t ***)(buffer + 8) = ppuVar9;
    __s->ip = uVar4;
    uVar3 = puVar5[0xf];
    *(long *)(buffer + 8) = (long)puVar5 + 0x1f;
    __s->prefix_length = (uint8_t)uVar3;
    local_88._M_head_impl = __s;
    if (4 < bVar2) {
      _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
      interpret<char,std::char_traits<char>,std::allocator<char>>(&local_80,this_00,ppuVar9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&(local_88._M_head_impl)->hwid,&local_80);
      ppuVar9 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        ppuVar9 = extraout_RDX_00;
      }
    }
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_80,this_00,ppuVar9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_88._M_head_impl)->rdns,&local_80);
    paVar1 = &local_80.field_2;
    ppuVar9 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      ppuVar9 = extraout_RDX_02;
    }
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_80,this_00,ppuVar9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_88._M_head_impl)->name,&local_80);
    ppuVar9 = extraout_RDX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      ppuVar9 = extraout_RDX_04;
    }
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_80,this_00,ppuVar9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_88._M_head_impl)->banner,&local_80);
    ppuVar9 = extraout_RDX_05;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      ppuVar9 = extraout_RDX_06;
    }
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_80,this_00,ppuVar9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_88._M_head_impl)->reason,&local_80);
    ppuVar9 = extraout_RDX_07;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      ppuVar9 = extraout_RDX_08;
    }
    lVar10 = **(long **)this_00;
    *(long **)this_00 = *(long **)this_00 + 1;
    if (lVar10 != 0) {
      do {
        _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
        interpret<char,std::char_traits<char>,std::allocator<char>>(&local_80,this_00,ppuVar9);
        _Var8._M_head_impl = local_88._M_head_impl;
        _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
        interpret<char,std::char_traits<char>,std::allocator<char>>(&local_50,this_00,head);
        this_01 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&(_Var8._M_head_impl)->varData,&local_50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this_01,&local_80);
        ppuVar9 = extraout_RDX_09;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          ppuVar9 = extraout_RDX_10;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          ppuVar9 = extraout_RDX_11;
        }
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    std::
    vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
    ::
    emplace_back<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>
              ((vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
                *)&local_60->m_entries,
               (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                *)&local_88);
    std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
    ~unique_ptr((unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                 *)&local_88);
  }
  return;
}

Assistant:

void RenX::BanDatabase::process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos)
{
	if (m_read_version < 3U)
		return; // incompatible database version

	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->pos = pos;

	// Read data from buffer to entry
	entry->flags = buffer.pop<uint16_t>();
	if (m_read_version >= 4U)
	{
		entry->timestamp = std::chrono::system_clock::time_point(std::chrono::seconds(buffer.pop<uint64_t>()));
		entry->length = std::chrono::seconds(buffer.pop<uint64_t>());
	}
	else
	{
		entry->timestamp = std::chrono::system_clock::from_time_t(buffer.pop<time_t>());
		entry->length = std::chrono::seconds(static_cast<long long>(buffer.pop<time_t>()));
	}
	entry->steamid = buffer.pop<uint64_t>();
	entry->ip = buffer.pop<uint32_t>();
	entry->prefix_length = buffer.pop<uint8_t>();
	if (m_read_version >= 5U)
		entry->hwid = buffer.pop<std::string>();
	entry->rdns = buffer.pop<std::string>();
	entry->name = buffer.pop<std::string>();
	entry->banner = buffer.pop<std::string>();
	entry->reason = buffer.pop<std::string>();

	// Read varData from buffer to entry
	for (size_t varData_entries = buffer.pop<size_t>(); varData_entries != 0; --varData_entries) {
		entry->varData[buffer.pop<std::string>()] = buffer.pop<std::string>();
	}

	m_entries.push_back(std::move(entry));
}